

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_iac(telnet_t *telnet,uchar cmd)

{
  uchar bytes [2];
  char local_2a;
  uchar local_29;
  telnet_event_t local_28;
  
  local_28.data.buffer = &local_2a;
  local_2a = -1;
  local_28.type = TELNET_EV_SEND;
  local_28.data.size = 2;
  local_29 = cmd;
  (*telnet->eh)(telnet,&local_28,telnet->ud);
  return;
}

Assistant:

void telnet_iac(telnet_t *telnet, unsigned char cmd) {
	unsigned char bytes[2];
	bytes[0] = TELNET_IAC;
	bytes[1] = cmd;
	_sendu(telnet, bytes, 2);
}